

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Gia_VtaDumpAbsracted(Vta_Man_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *pInit;
  char *local_38;
  Gia_Man_t *pAbs;
  char *pFileName;
  char *pFileNameDef;
  int fVerbose_local;
  Vta_Man_t *p_local;
  
  if (p->pPars->pFileVabs == (char *)0x0) {
    local_38 = "vabs.aig";
  }
  else {
    local_38 = p->pPars->pFileVabs;
  }
  if (fVerbose != 0) {
    Abc_Print(1,"Dumping abstracted model into file \"%s\"...\n",local_38);
  }
  Vec_IntFreeP(&p->pGia->vObjClasses);
  pVVar1 = Gia_VtaFramesToAbs((Vec_Vec_t *)p->vCores);
  p->pGia->vObjClasses = pVVar1;
  Vec_IntFreeP(&p->pGia->vGateClasses);
  pVVar1 = Gia_VtaConvertToGla(p->pGia,p->pGia->vObjClasses);
  p->pGia->vGateClasses = pVVar1;
  Vec_IntFreeP(&p->pGia->vObjClasses);
  pInit = Gia_ManDupAbsGates(p->pGia,p->pGia->vGateClasses);
  Vec_IntFreeP(&p->pGia->vGateClasses);
  Gia_AigerWrite(pInit,local_38,0,0,0);
  Gia_ManStop(pInit);
  return;
}

Assistant:

void Gia_VtaDumpAbsracted( Vta_Man_t * p, int fVerbose )
{
    char * pFileNameDef = "vabs.aig";
    char * pFileName = p->pPars->pFileVabs ? p->pPars->pFileVabs : pFileNameDef;
    Gia_Man_t * pAbs;
    if ( fVerbose )
        Abc_Print( 1, "Dumping abstracted model into file \"%s\"...\n", pFileName );
    // create obj classes
    Vec_IntFreeP( &p->pGia->vObjClasses );
    p->pGia->vObjClasses = Gia_VtaFramesToAbs( (Vec_Vec_t *)p->vCores );
    // create gate classes
    Vec_IntFreeP( &p->pGia->vGateClasses );
    p->pGia->vGateClasses = Gia_VtaConvertToGla( p->pGia, p->pGia->vObjClasses );
    Vec_IntFreeP( &p->pGia->vObjClasses );
    // create abstrated model
    pAbs = Gia_ManDupAbsGates( p->pGia, p->pGia->vGateClasses );
    Vec_IntFreeP( &p->pGia->vGateClasses );
    // send it out
    Gia_AigerWrite( pAbs, pFileName, 0, 0, 0 );
    Gia_ManStop( pAbs );
}